

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O0

bool SetRange(FRemapTable *table,int start,int end,int first,int last)

{
  int iVar1;
  bool bVar2;
  int local_30;
  int pi_1;
  int i;
  int palrange;
  int pi;
  bool identity;
  int last_local;
  int first_local;
  int end_local;
  int start_local;
  FRemapTable *table_local;
  
  bVar2 = true;
  if (start == end) {
    iVar1 = (first + last) / 2;
    table->Remap[start] = GPalette.Remap[iVar1];
    bVar2 = iVar1 == start;
    table->Palette[start].field_0 = GPalette.BaseColors[table->Remap[start]].field_0;
    table->Palette[start].field_0.field_0.a = 0xff;
  }
  else {
    for (local_30 = start; local_30 <= end; local_30 = local_30 + 1) {
      iVar1 = first + ((last - first) * (local_30 - start)) / (end - start);
      table->Remap[local_30] = GPalette.Remap[iVar1];
      bVar2 = (bool)(bVar2 & iVar1 == local_30);
      table->Palette[local_30].field_0 = GPalette.BaseColors[table->Remap[local_30]].field_0;
      table->Palette[local_30].field_0.field_0.a = 0xff;
    }
  }
  return bVar2;
}

Assistant:

static bool SetRange(FRemapTable *table, int start, int end, int first, int last)
{
	bool identity = true;
	if (start == end)
	{
		int pi = (first + last) / 2;
		table->Remap[start] = GPalette.Remap[pi];
		identity &= (pi == start);
		table->Palette[start] = GPalette.BaseColors[table->Remap[start]];
		table->Palette[start].a = 255;
	}
	else
	{
		int palrange = last - first;
		for (int i = start; i <= end; ++i)
		{
			int pi = first + palrange * (i - start) / (end - start);
			table->Remap[i] = GPalette.Remap[pi];
			identity &= (pi == i);
			table->Palette[i] = GPalette.BaseColors[table->Remap[i]];
			table->Palette[i].a = 255;
		}
	}
	return identity;
}